

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Commands.cpp
# Opt level: O3

void __thiscall
PhaseBotsGameCommand::trigger
          (PhaseBotsGameCommand *this,Server *source,PlayerInfo *player,string_view parameters)

{
  bool bVar1;
  char *pcVar2;
  undefined8 uVar3;
  basic_string_view<char,_std::char_traits<char>_> rhs;
  basic_string_view<char,_std::char_traits<char>_> rhs_00;
  basic_string_view<char,_std::char_traits<char>_> rhs_01;
  basic_string_view<char,_std::char_traits<char>_> rhs_02;
  
  if (parameters._M_len == 0) {
    bVar1 = togglePhasing(source);
    if (!bVar1) {
LAB_001330a8:
      pcVar2 = "Bot phasing has been disabled.";
      uVar3 = 0x1e;
      goto LAB_001330b4;
    }
  }
  else {
    rhs._M_str = "true";
    rhs._M_len = 4;
    bVar1 = jessilib::equalsi<char,char>(parameters,rhs);
    if (!bVar1) {
      rhs_00._M_str = "on";
      rhs_00._M_len = 2;
      bVar1 = jessilib::equalsi<char,char>(parameters,rhs_00);
      if (!bVar1) {
        rhs_01._M_str = "start";
        rhs_01._M_len = 5;
        bVar1 = jessilib::equalsi<char,char>(parameters,rhs_01);
        if (!bVar1) {
          rhs_02._M_str = "1";
          rhs_02._M_len = 1;
          bVar1 = jessilib::equalsi<char,char>(parameters,rhs_02);
          if (!bVar1) {
            togglePhasing(source,false);
            goto LAB_001330a8;
          }
        }
      }
    }
    togglePhasing(source,true);
  }
  pcVar2 = "Bot phasing has been enabled.";
  uVar3 = 0x1d;
LAB_001330b4:
  RenX::Server::sendMessage(source,player,uVar3,pcVar2);
  return;
}

Assistant:

void PhaseBotsGameCommand::trigger(RenX::Server *source, RenX::PlayerInfo *player, std::string_view parameters) {
	if (parameters.empty())
	{
		if (togglePhasing(source))
			source->sendMessage(*player, "Bot phasing has been enabled."sv);
		else source->sendMessage(*player, "Bot phasing has been disabled."sv);
	}
	else if (jessilib::equalsi(parameters, "true"sv) || jessilib::equalsi(parameters, "on"sv)
		|| jessilib::equalsi(parameters, "start"sv) || jessilib::equalsi(parameters, "1"sv)) {
		togglePhasing(source, true);
		source->sendMessage(*player, "Bot phasing has been enabled."sv);
	}
	else
	{
		togglePhasing(source, false);
		source->sendMessage(*player, "Bot phasing has been disabled."sv);
	}
}